

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

string * __thiscall
tinyusdz::Path::full_path_name_abi_cxx11_(string *__return_storage_ptr__,Path *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this->_valid == false) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  if ((this->_prop_part)._M_string_length != 0) {
    ::std::operator+(&bStack_38,".",&this->_prop_part);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::_M_dispose();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string full_path_name() const {
    std::string s;
    if (!_valid) {
      s += "#INVALID#";
    }

    s += _prim_part;
    if (_prop_part.empty()) {
      return s;
    }

    s += "." + _prop_part;

    return s;
  }